

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O2

FrameDisplay * __thiscall Js::DiagStackFrame::GetFrameDisplay(DiagStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  int iVar4;
  FunctionBody *pFVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  ScriptFunction *pSVar7;
  
  pFVar5 = GetFunction(this);
  if (pFVar5 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x47,"(this->GetFunction() != __null)",
                                "this->GetFunction() != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pFVar5 = GetFunction(this);
  RVar3 = FunctionBody::GetFrameDisplayRegister(pFVar5);
  if (RVar3 - 1 < 0xfffffffe) {
    iVar4 = (*this->_vptr_DiagStackFrame[6])(this,(ulong)RVar3);
    return (FrameDisplay *)CONCAT44(extraout_var,iVar4);
  }
  pSVar7 = GetScriptFunction(this);
  return (pSVar7->environment).ptr;
}

Assistant:

FrameDisplay * DiagStackFrame::GetFrameDisplay()
    {
        FrameDisplay *display = NULL;

        Assert(this->GetFunction() != NULL);
        RegSlot frameDisplayReg = this->GetFunction()->GetFrameDisplayRegister();

        if (frameDisplayReg != Js::Constants::NoRegister && frameDisplayReg != 0)
        {
            display = (FrameDisplay*)this->GetNonVarRegValue(frameDisplayReg);
        }
        else
        {
            display = this->GetScriptFunction()->GetEnvironment();
        }

        return display;
    }